

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffm_score.cc
# Opt level: O1

void __thiscall
xLearn::FFMScore::calc_grad_ftrl(FFMScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  pointer pNVar1;
  float *pfVar2;
  float *pfVar3;
  real_t *prVar4;
  float fVar5;
  real_t rVar6;
  float fVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  real_t *prVar11;
  undefined8 uVar12;
  float fVar13;
  bool bVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  pointer pNVar25;
  pointer pNVar26;
  long lVar27;
  pointer pNVar28;
  uint uVar29;
  ulong uVar30;
  float fVar31;
  float fVar32;
  real_t rVar35;
  float fVar36;
  undefined1 auVar37 [16];
  float fVar33;
  undefined1 auVar38 [16];
  float fVar34;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar47 [16];
  
  auVar43._4_60_ = in_register_00001244;
  auVar43._0_4_ = norm;
  if (norm < 0.0) {
    fVar33 = sqrtf(norm);
  }
  else {
    auVar39 = vsqrtss_avx(auVar43._0_16_,auVar43._0_16_);
    fVar33 = auVar39._0_4_;
  }
  auVar39 = in_ZMM6._0_16_;
  uVar8 = model->num_feat_;
  uVar9 = model->num_field_;
  pNVar25 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (pNVar25 !=
      (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    prVar11 = model->param_w_;
    do {
      uVar10 = pNVar25->feat_id;
      if (uVar10 < uVar8) {
        uVar15 = uVar10 * 3;
        uVar29 = uVar10 * 3 + 1;
        auVar37 = vfmadd231ss_fma(ZEXT416((uint)(pg * pNVar25->feat_val * fVar33)),
                                  ZEXT416((uint)(this->super_Score).lambda_2_),
                                  ZEXT416((uint)prVar11[uVar15]));
        fVar34 = prVar11[uVar29];
        auVar39 = vfmadd213ss_fma(auVar37,auVar37,ZEXT416((uint)fVar34));
        fVar31 = auVar39._0_4_;
        prVar11[uVar29] = fVar31;
        if (fVar31 < 0.0) {
          fVar31 = sqrtf(fVar31);
        }
        else {
          auVar39 = vsqrtss_avx(auVar39,auVar39);
          fVar31 = auVar39._0_4_;
        }
        if (fVar34 < 0.0) {
          fVar34 = sqrtf(fVar34);
        }
        else {
          auVar39 = vsqrtss_avx(ZEXT416((uint)fVar34),ZEXT416((uint)fVar34));
          fVar34 = auVar39._0_4_;
        }
        uVar10 = uVar10 * 3 + 2;
        auVar39._0_4_ = (fVar31 - fVar34) / (this->super_Score).alpha_;
        auVar39._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar39 = vfnmadd231ss_fma(ZEXT416(auVar37._0_4_),auVar39,ZEXT416((uint)prVar11[uVar15]));
        fVar31 = auVar39._0_4_ + prVar11[uVar10];
        prVar11[uVar10] = fVar31;
        auVar37 = ZEXT816(0);
        uVar12 = vcmpss_avx512f(auVar37,ZEXT416((uint)fVar31),1);
        bVar14 = (bool)((byte)uVar12 & 1);
        fVar13 = (float)((uint)bVar14 * 0x3f800000 + (uint)!bVar14 * -0x40800000);
        fVar34 = (this->super_Score).lambda_1_;
        if (fVar34 < fVar31 * fVar13) {
          fVar5 = (this->super_Score).beta_;
          fVar32 = prVar11[uVar29];
          if (fVar32 < 0.0) {
            fVar32 = sqrtf(fVar32);
          }
          else {
            auVar39 = vsqrtss_avx(ZEXT416((uint)fVar32),ZEXT416((uint)fVar32));
            fVar32 = auVar39._0_4_;
          }
          auVar39 = vfmsub213ss_fma(ZEXT416((uint)fVar34),ZEXT416((uint)fVar13),
                                    ZEXT416((uint)fVar31));
          auVar37._0_4_ =
               auVar39._0_4_ /
               ((fVar5 + fVar32) / (this->super_Score).alpha_ + (this->super_Score).lambda_2_);
          auVar37._4_12_ = auVar39._4_12_;
        }
        prVar11[uVar15] = auVar37._0_4_;
      }
      auVar39 = in_ZMM6._0_16_;
      pNVar25 = pNVar25 + 1;
    } while (pNVar25 !=
             (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  prVar11 = model->param_b_;
  fVar33 = prVar11[1];
  auVar37 = vfmadd213ss_fma(ZEXT416((uint)pg),ZEXT416((uint)pg),ZEXT416((uint)fVar33));
  fVar34 = auVar37._0_4_;
  prVar11[1] = fVar34;
  if (fVar34 < 0.0) {
    fVar34 = sqrtf(fVar34);
  }
  else {
    auVar37 = vsqrtss_avx(auVar37,auVar37);
    fVar34 = auVar37._0_4_;
  }
  if (fVar33 < 0.0) {
    fVar33 = sqrtf(fVar33);
  }
  else {
    auVar37 = vsqrtss_avx(ZEXT416((uint)fVar33),ZEXT416((uint)fVar33));
    fVar33 = auVar37._0_4_;
  }
  auVar38._0_4_ = (fVar34 - fVar33) / (this->super_Score).alpha_;
  auVar38._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar37 = vfnmadd132ss_fma(auVar38,ZEXT416((uint)pg),ZEXT416((uint)*prVar11));
  fVar34 = auVar37._0_4_ + prVar11[2];
  prVar11[2] = fVar34;
  auVar41._0_12_ = ZEXT812(0);
  auVar41._12_4_ = 0;
  uVar12 = vcmpss_avx512f(auVar41,ZEXT416((uint)fVar34),1);
  bVar14 = (bool)((byte)uVar12 & 1);
  fVar31 = (float)((uint)bVar14 * 0x3f800000 + (uint)!bVar14 * -0x40800000);
  fVar33 = (this->super_Score).lambda_1_;
  if (fVar33 < fVar34 * fVar31) {
    auVar37 = vfmsub213ss_fma(ZEXT416((uint)fVar33),ZEXT416((uint)fVar31),ZEXT416((uint)fVar34));
    fVar33 = (this->super_Score).beta_;
    fVar34 = prVar11[1];
    if (fVar34 < 0.0) {
      fVar34 = sqrtf(fVar34);
      auVar37 = ZEXT416(auVar37._0_4_);
    }
    else {
      auVar38 = vsqrtss_avx(ZEXT416((uint)fVar34),ZEXT416((uint)fVar34));
      fVar34 = auVar38._0_4_;
    }
    auVar41._0_4_ =
         auVar37._0_4_ /
         ((fVar33 + fVar34) / (this->super_Score).alpha_ + (this->super_Score).lambda_2_);
    auVar41._4_12_ = auVar37._4_12_;
  }
  *prVar11 = auVar41._0_4_;
  pNVar25 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (pNVar25 !=
      (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    auVar39 = vcvtusi2ss_avx512f(auVar39,model->num_K_);
    auVar39 = ZEXT416((uint)(auVar39._0_4_ * 0.25));
    auVar39 = vroundss_avx(auVar39,auVar39,10);
    iVar20 = vcvttss2usi_avx512f(auVar39);
    uVar10 = iVar20 * 0xc;
    iVar20 = model->num_field_ * uVar10;
    prVar11 = model->param_v_;
    rVar6 = (this->super_Score).alpha_;
    fVar33 = (this->super_Score).lambda_2_;
    do {
      if ((pNVar25->field_id < uVar9 && pNVar25->feat_id < uVar8) &&
         (pNVar25 + 1 !=
          (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
          super__Vector_impl_data._M_finish)) {
        uVar21 = (ulong)(pNVar25->feat_id * iVar20);
        uVar23 = (ulong)(pNVar25->field_id * uVar10);
        fVar34 = pNVar25->feat_val;
        pNVar26 = pNVar25;
        pNVar28 = pNVar25 + 1;
        do {
          if ((pNVar26[1].field_id < uVar9 && pNVar26[1].feat_id < uVar8) && (uVar10 != 0)) {
            uVar22 = (ulong)(pNVar26[1].field_id * uVar10);
            uVar24 = (ulong)(pNVar26[1].feat_id * iVar20);
            fVar31 = fVar34 * pNVar26[1].feat_val * norm * pg;
            uVar30 = 0;
            do {
              pfVar2 = prVar11 + uVar21 + uVar22 + uVar30;
              fVar13 = *pfVar2;
              fVar5 = pfVar2[1];
              fVar32 = pfVar2[2];
              fVar7 = pfVar2[3];
              auVar39 = *(undefined1 (*) [16])(prVar11 + uVar21 + uVar22 + uVar30 + 4);
              pfVar2 = prVar11 + uVar23 + uVar24 + uVar30;
              fVar36 = *pfVar2;
              fVar16 = pfVar2[1];
              fVar17 = pfVar2[2];
              fVar18 = pfVar2[3];
              auVar37 = *(undefined1 (*) [16])(prVar11 + uVar23 + uVar24 + uVar30 + 4);
              auVar44._0_4_ = fVar33 * fVar13 + fVar31 * fVar36;
              auVar44._4_4_ = fVar33 * fVar5 + fVar31 * fVar16;
              auVar44._8_4_ = fVar33 * fVar32 + fVar31 * fVar17;
              auVar44._12_4_ = fVar33 * fVar7 + fVar31 * fVar18;
              auVar45._0_4_ = fVar31 * fVar13 + fVar33 * fVar36;
              auVar45._4_4_ = fVar31 * fVar5 + fVar33 * fVar16;
              auVar45._8_4_ = fVar31 * fVar32 + fVar33 * fVar17;
              auVar45._12_4_ = fVar31 * fVar7 + fVar33 * fVar18;
              auVar46._0_4_ = auVar39._0_4_ + auVar44._0_4_ * auVar44._0_4_;
              auVar46._4_4_ = auVar39._4_4_ + auVar44._4_4_ * auVar44._4_4_;
              auVar46._8_4_ = auVar39._8_4_ + auVar44._8_4_ * auVar44._8_4_;
              auVar46._12_4_ = auVar39._12_4_ + auVar44._12_4_ * auVar44._12_4_;
              auVar38 = vsqrtps_avx(auVar46);
              auVar39 = vsqrtps_avx(auVar39);
              auVar39 = vsubps_avx(auVar38,auVar39);
              auVar19._4_4_ = rVar6;
              auVar19._0_4_ = rVar6;
              auVar19._8_4_ = rVar6;
              auVar19._12_4_ = rVar6;
              auVar39 = vdivps_avx(auVar39,auVar19);
              auVar47._0_4_ = auVar37._0_4_ + auVar45._0_4_ * auVar45._0_4_;
              auVar47._4_4_ = auVar37._4_4_ + auVar45._4_4_ * auVar45._4_4_;
              auVar47._8_4_ = auVar37._8_4_ + auVar45._8_4_ * auVar45._8_4_;
              auVar47._12_4_ = auVar37._12_4_ + auVar45._12_4_ * auVar45._12_4_;
              auVar38 = vsqrtps_avx(auVar47);
              auVar37 = vsqrtps_avx(auVar37);
              auVar37 = vsubps_avx(auVar38,auVar37);
              auVar37 = vdivps_avx(auVar37,auVar19);
              auVar40._0_4_ = fVar13 * auVar39._0_4_;
              auVar40._4_4_ = fVar5 * auVar39._4_4_;
              auVar40._8_4_ = fVar32 * auVar39._8_4_;
              auVar40._12_4_ = fVar7 * auVar39._12_4_;
              auVar39 = vsubps_avx(auVar44,auVar40);
              pfVar2 = prVar11 + uVar21 + uVar22 + uVar30 + 8;
              fVar13 = pfVar2[1];
              fVar5 = pfVar2[2];
              fVar32 = pfVar2[3];
              auVar42._0_4_ = fVar36 * auVar37._0_4_;
              auVar42._4_4_ = fVar16 * auVar37._4_4_;
              auVar42._8_4_ = fVar17 * auVar37._8_4_;
              auVar42._12_4_ = fVar18 * auVar37._12_4_;
              auVar37 = vsubps_avx(auVar45,auVar42);
              pfVar3 = prVar11 + uVar23 + uVar24 + uVar30 + 8;
              fVar7 = *pfVar3;
              fVar36 = pfVar3[1];
              fVar16 = pfVar3[2];
              fVar17 = pfVar3[3];
              prVar4 = prVar11 + uVar21 + uVar22 + uVar30 + 8;
              *prVar4 = auVar39._0_4_ + *pfVar2;
              prVar4[1] = auVar39._4_4_ + fVar13;
              prVar4[2] = auVar39._8_4_ + fVar5;
              prVar4[3] = auVar39._12_4_ + fVar32;
              prVar4 = prVar11 + uVar23 + uVar24 + uVar30 + 8;
              *prVar4 = auVar37._0_4_ + fVar7;
              prVar4[1] = auVar37._4_4_ + fVar36;
              prVar4[2] = auVar37._8_4_ + fVar16;
              prVar4[3] = auVar37._12_4_ + fVar17;
              *(undefined1 (*) [16])(prVar11 + uVar21 + uVar22 + uVar30 + 4) = auVar46;
              *(undefined1 (*) [16])(prVar11 + uVar23 + uVar24 + uVar30 + 4) = auVar47;
              lVar27 = -4;
              do {
                fVar13 = prVar11[uVar21 + uVar22 + uVar30 + lVar27 + 0xc];
                auVar43 = ZEXT1664(ZEXT816(0) << 0x40);
                uVar12 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)fVar13),1);
                bVar14 = (bool)((byte)uVar12 & 1);
                fVar32 = (float)((uint)bVar14 * 0x3f800000 + (uint)!bVar14 * -0x40800000);
                fVar5 = (this->super_Score).lambda_1_;
                rVar35 = 0.0;
                if (fVar5 < fVar13 * fVar32) {
                  fVar7 = (this->super_Score).beta_;
                  fVar36 = prVar11[uVar21 + uVar22 + uVar30 + lVar27 + 8];
                  if (fVar36 < 0.0) {
                    fVar36 = sqrtf(fVar36);
                    auVar43 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  else {
                    auVar39 = vsqrtss_avx(ZEXT416((uint)fVar36),ZEXT416((uint)fVar36));
                    fVar36 = auVar39._0_4_;
                  }
                  auVar39 = vfmsub213ss_fma(ZEXT416((uint)fVar5),ZEXT416((uint)fVar32),
                                            ZEXT416((uint)fVar13));
                  rVar35 = auVar39._0_4_ /
                           ((fVar7 + fVar36) / (this->super_Score).alpha_ +
                           (this->super_Score).lambda_2_);
                }
                prVar11[uVar21 + uVar22 + uVar30 + lVar27 + 4] = rVar35;
                fVar13 = prVar11[uVar23 + uVar24 + uVar30 + lVar27 + 0xc];
                uVar12 = vcmpss_avx512f(auVar43._0_16_,ZEXT416((uint)fVar13),1);
                bVar14 = (bool)((byte)uVar12 & 1);
                fVar32 = (float)((uint)bVar14 * 0x3f800000 + (uint)!bVar14 * -0x40800000);
                fVar5 = (this->super_Score).lambda_1_;
                if (fVar5 < fVar13 * fVar32) {
                  fVar7 = (this->super_Score).beta_;
                  fVar36 = prVar11[uVar23 + uVar24 + uVar30 + lVar27 + 8];
                  if (fVar36 < 0.0) {
                    fVar36 = sqrtf(fVar36);
                  }
                  else {
                    auVar39 = vsqrtss_avx(ZEXT416((uint)fVar36),ZEXT416((uint)fVar36));
                    fVar36 = auVar39._0_4_;
                  }
                  auVar39 = vfmsub213ss_fma(ZEXT416((uint)fVar5),ZEXT416((uint)fVar32),
                                            ZEXT416((uint)fVar13));
                  auVar43 = ZEXT1664(CONCAT124(auVar39._4_12_,
                                               auVar39._0_4_ /
                                               ((fVar7 + fVar36) / (this->super_Score).alpha_ +
                                               (this->super_Score).lambda_2_)));
                }
                prVar11[uVar23 + uVar24 + uVar30 + lVar27 + 4] = auVar43._0_4_;
                lVar27 = lVar27 + 1;
              } while (lVar27 != 0);
              uVar29 = (int)uVar30 + 0xc;
              uVar30 = (ulong)uVar29;
            } while (uVar29 < uVar10);
          }
          pNVar1 = pNVar28 + 1;
          pNVar26 = pNVar28;
          pNVar28 = pNVar1;
        } while (pNVar1 != (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>).
                           _M_impl.super__Vector_impl_data._M_finish);
      }
      pNVar25 = pNVar25 + 1;
    } while (pNVar25 !=
             (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void FFMScore::calc_grad_ftrl(const SparseRow* row,
                              Model& model,
                              real_t pg,
                              real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/  
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  index_t num_field = model.GetNumField();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    real_t &wl = w[feat_id*3];
    real_t &wlg = w[feat_id*3+1];
    real_t &wlz = w[feat_id*3+2];
    real_t g = lambda_2_*wl+pg*iter->feat_val*sqrt_norm; 
    real_t old_wlg = wlg;
    wlg += g*g;
    real_t sigma = (sqrt(wlg)-sqrt(old_wlg)) / alpha_;
    wlz += (g-sigma*wl);
    int sign = wlz > 0 ? 1:-1;
    if (sign*wlz <= lambda_1_) {
      wl = 0;
    } else {
      wl = (sign*lambda_1_-wlz) / 
           ((beta_ + sqrt(wlg)) / 
            alpha_ + lambda_2_);
    }
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t &wbg = w[1];
  real_t &wbz = w[2];
  real_t g = pg;
  real_t old_wbg = wbg;
  wbg += g*g;
  real_t sigma = (sqrt(wbg)-sqrt(old_wbg)) / alpha_;
  wbz += (g-sigma*wb);
  int sign = wbz > 0 ? 1:-1;
  if (sign*wbz <= lambda_1_) {
    wb = 0;
  } else {
    wb = (sign*lambda_1_-wbz) / 
         ((beta_ + sqrt(wbg)) / 
          alpha_ + lambda_2_);
  }
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t align0 = 3 * model.get_aligned_k();
  index_t align1 = model.GetNumField() * align0;
  index_t align = kAlign * 3;
  w = model.GetParameter_v();
  __m128 XMMpg = _mm_set1_ps(pg);
  __m128 XMMalpha = _mm_set1_ps(alpha_);
  __m128 XMML2 = _mm_set1_ps(lambda_2_);
  for (SparseRow::const_iterator iter_i = row->begin();
       iter_i != row->end(); ++iter_i) {
    index_t j1 = iter_i->feat_id;
    index_t f1 = iter_i->field_id;
    // To avoid unseen feature
    if (j1 >= num_feat || f1 >= num_field) continue;
    real_t v1 = iter_i->feat_val;
    for (SparseRow::const_iterator iter_j = iter_i+1;
         iter_j != row->end(); ++iter_j) {
      index_t j2 = iter_j->feat_id;
      index_t f2 = iter_j->field_id;
      // To avoid unseen feature
      if (j2 >= num_feat || f2 >= num_field) continue;
      real_t v2 = iter_j->feat_val;
      real_t* w1_base = w + j1*align1 + f2*align0;
      real_t* w2_base = w + j2*align1 + f1*align0;
      __m128 XMMv = _mm_set1_ps(v1*v2*norm);
      __m128 XMMpgv = _mm_mul_ps(XMMv, XMMpg);
      for (index_t d = 0; d < align0; d += align) {
        real_t *w1 = w1_base + d;
        real_t *w2 = w2_base + d;
        real_t *wg1 = w1 + kAlign;
        real_t *wg2 = w2 + kAlign;
        real_t *z1 = w1 + kAlign * 2;
        real_t *z2 = w2 + kAlign * 2;
        __m128 XMMw1 = _mm_load_ps(w1);
        __m128 XMMw2 = _mm_load_ps(w2);
        __m128 XMMwg1 = _mm_load_ps(wg1);
        __m128 XMMwg2 = _mm_load_ps(wg2);
        __m128 XMMz1 = _mm_load_ps(z1);
        __m128 XMMz2 = _mm_load_ps(z2);
        __m128 XMMg1 = _mm_add_ps(
                       _mm_mul_ps(XMML2, XMMw1),
                       _mm_mul_ps(XMMpgv, XMMw2));
        __m128 XMMg2 = _mm_add_ps(
                       _mm_mul_ps(XMML2, XMMw2),
                       _mm_mul_ps(XMMpgv, XMMw1));
        __m128 XMMsigma1 = _mm_div_ps(
                           _mm_sub_ps(
                           _mm_sqrt_ps(
                           _mm_add_ps(XMMwg1,
                           _mm_mul_ps(XMMg1, XMMg1))),
                           _mm_sqrt_ps(XMMwg1)), XMMalpha);
        __m128 XMMsigma2 = _mm_div_ps(
                           _mm_sub_ps(
                           _mm_sqrt_ps(
                           _mm_add_ps(XMMwg2,
                           _mm_mul_ps(XMMg2, XMMg2))),
                           _mm_sqrt_ps(XMMwg2)), XMMalpha);
        XMMz1 = _mm_add_ps(XMMz1,
                _mm_sub_ps(XMMg1,
                _mm_mul_ps(XMMsigma1, XMMw1)));
        XMMz2 = _mm_add_ps(XMMz2,
                _mm_sub_ps(XMMg2,
                _mm_mul_ps(XMMsigma2, XMMw2)));
        _mm_store_ps(z1, XMMz1);
        _mm_store_ps(z2, XMMz2);
        XMMwg1 = _mm_add_ps(XMMwg1,
                 _mm_mul_ps(XMMg1, XMMg1));
        XMMwg2 = _mm_add_ps(XMMwg2,
                 _mm_mul_ps(XMMg2, XMMg2));
        _mm_store_ps(wg1, XMMwg1);
        _mm_store_ps(wg2, XMMwg2);
        // Update w. SSE may not faster
        for (size_t i = 0; i < kAlign; ++i) {
          // w1
          real_t z1_value = *(z1+i);
          int sign = z1_value > 0 ? 1 : -1;
          if (sign * z1_value <= lambda_1_) {
            *(w1+i) = 0;
          } else {
            *(w1+i) = (sign*lambda_1_-z1_value) / 
              ((beta_ + sqrt(*(wg1+i))) / alpha_ + lambda_2_);
          }
          // w2
          real_t z2_value = *(z2+i);
          sign = z2_value > 0 ? 1 : -1;
          if (sign * z2_value <= lambda_1_) {
            *(w2+i) = 0;
          } else {
            *(w2+i) = (sign*lambda_1_-z2_value) / 
              ((beta_ + sqrt(*(wg2+i))) / alpha_ + lambda_2_);
          }
        }
      }
    }
  }
}